

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_spec.c
# Opt level: O3

void test_delimiters_7(void)

{
  run("surrounding whitespace should be left untouched","| {{=@ @=}} |","{}",(char *)0x0,"|  |");
  return;
}

Assistant:

static void
test_delimiters_7(void)
{
    run(
        "surrounding whitespace should be left untouched",
        "| {{=@ @=}} |",
        "{}",
        NULL,
        "|  |"
    );
}